

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators_example.cc
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *this;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l;
  initializer_list<char> __l_00;
  bool bVar1;
  reference pcVar2;
  ostream *poVar3;
  pointer ppVar4;
  reference __p;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_190;
  undefined1 local_160 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  copy_of_pair;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_128;
  iterator map_iterator;
  int local_118 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_e0;
  iterator local_b8;
  size_type local_b0;
  undefined1 local_a8 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  name_to_id;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_68;
  iterator ending_iterator;
  iterator iterator;
  allocator_type local_46;
  char local_45 [5];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<char,_std::allocator<char>_> my_chars;
  char **argv_local;
  int argc_local;
  
  builtin_strncpy(local_45,"abcde",5);
  local_40 = local_45;
  local_38 = 5;
  my_chars.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = argv;
  std::allocator<char>::allocator();
  __l_00._M_len = local_38;
  __l_00._M_array = local_40;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_30,__l_00,&local_46);
  std::allocator<char>::~allocator(&local_46);
  ending_iterator =
       std::vector<char,_std::allocator<char>_>::begin
                 ((vector<char,_std::allocator<char>_> *)local_30);
  local_68._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)local_30);
  std::operator<<((ostream *)&std::cout,"Print out the vector:\n");
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&ending_iterator,&local_68);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&ending_iterator);
    poVar3 = std::operator<<((ostream *)&std::cout,*pcVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
              (&ending_iterator);
  }
  name_to_id._M_h._M_single_bucket =
       (__node_base_ptr)
       std::vector<char,_std::allocator<char>_>::begin
                 ((vector<char,_std::allocator<char>_> *)local_30);
  ending_iterator._M_current = (char *)name_to_id._M_h._M_single_bucket;
  pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
           operator*(&ending_iterator);
  *pcVar2 = 'x';
  std::operator<<((ostream *)&std::cout,"Print out the vector:\n");
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&ending_iterator,&local_68);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&ending_iterator);
    poVar3 = std::operator<<((ostream *)&std::cout,*pcVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
              (&ending_iterator);
  }
  local_110 = &local_108;
  local_118[1] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[7],_int,_true>(local_110,(char (*) [7])"victor",local_118 + 1);
  local_110 = &local_e0;
  local_118[0] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(local_110,(char (*) [5])"john",local_118);
  local_b8 = &local_108;
  local_b0 = 2;
  this = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
          *)((long)&map_iterator.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                    ._M_cur + 5);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::allocator(this);
  __l._M_len = local_b0;
  __l._M_array = local_b8;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)local_a8,__l,0,
                  (hasher *)
                  ((long)&map_iterator.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                          ._M_cur + 7),
                  (key_equal *)
                  ((long)&map_iterator.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                          ._M_cur + 6),this);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                *)((long)&map_iterator.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                          ._M_cur + 5));
  local_190 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               *)&local_b8;
  do {
    local_190 = local_190 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair(local_190);
  } while (local_190 != &local_108);
  std::__detail::
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
  ::_Node_iterator((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                    *)&local_128);
  local_128._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)local_a8);
  while( true ) {
    copy_of_pair._32_8_ =
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)local_a8);
    bVar1 = std::__detail::operator!=
                      (&local_128,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                        *)&copy_of_pair.second);
    if (!bVar1) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"Key=");
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                           *)&local_128);
    poVar3 = std::operator<<(poVar3,(string *)ppVar4);
    poVar3 = std::operator<<(poVar3," Value=");
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                           *)&local_128);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,ppVar4->second);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __p = std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
          ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                       *)&local_128);
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)local_160,__p);
    poVar3 = std::operator<<((ostream *)&std::cout,"Copied Key=");
    poVar3 = std::operator<<(poVar3,(string *)local_160);
    poVar3 = std::operator<<(poVar3," Copied Value=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,copy_of_pair._24_4_);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)local_160);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                  *)&local_128);
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)local_a8);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_30)
  ;
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  // Let's create a vector and iterate it using iterators.
  // Note that we are initializing the vector from an initialization list.
  std::vector<char> my_chars = {'a', 'b', 'c', 'd', 'e'};
  // Iterators are objects that allow the user to iterate a c++ collection.
  // These collections can be vectors, maps, sets, and others. Iterators
  // behave like points. That is that they can be incremented, decremented, and
  // dereferenced to access the content. This binary will give an example using
  // a vector and an unordered_map.
  // To get an iterator at the beginning of the collection, we call the method
  // begin(). If we desire to get an iterator at the end, we simply call the
  // method end(). The end of a collection does not point to the last entry. It
  // points to the subsequent entry where new data can be stored.
  // Iterators can be compared, for instance, the iterators begin() <= end(), or
  // begin() != end().
  // Note that the iterators require to know the collection and the type it
  // holds.
  std::vector<char>::iterator iterator = my_chars.begin();
  std::vector<char>::iterator ending_iterator = my_chars.end();
  // The for loop will use the iterator that points at the beginning of the
  // vector to access the elements in it.
  std::cout << "Print out the vector:\n";
  for (; iterator != ending_iterator; ++iterator) {
    // To acccess the value of an iterator, we use the dereference operator
    // as if the iterator was a pointer.
    std::cout << *iterator << std::endl;
  }
  // Since iterators act like points, we can change the value of entries.
  // For instance, to change the value of the first entry.
  iterator = my_chars.begin();
  *iterator = 'x';
  // The for loop will use the iterator that points at the beginning of the
  // vector to access the elements in it.
  std::cout << "Print out the vector:\n";
  for (; iterator != ending_iterator; ++iterator) {
    // To acccess the value of an iterator, we use the dereference operator
    // as if the iterator was a pointer.
    std::cout << *iterator << std::endl;
  }

  // Let's create a map and iterate it using iterators.
  std::unordered_map<std::string, int> name_to_id =
      {{"victor", 1}, {"john", 2}};
  // Let's define an iterator for this map. Remember that the iterators must
  // know the structure and the type they point to.
  std::unordered_map<std::string, int>::iterator map_iterator;
  // Let map_iterator point to the begining of the map.
  map_iterator = name_to_id.begin();
  for (; map_iterator != name_to_id.end(); ++map_iterator) {
    // Remember that the internal structure of a map is an std::pair. Recall
    // that std::pair has two members: first and second. Since iterator acts
    // like a pointer we need to use the '->' operator to access the members
    // of the pair. For instance:
    std::cout << "Key=" << map_iterator->first
              << " Value=" << map_iterator->second
              << std::endl;
    // To clarify this, let's make a copy of the pointer pair. To make the copy
    // we declare a pair with the same data type for its members. Then, we
    // dereference the iterator to access the pointed value.
    std::pair<std::string, int> copy_of_pair = *map_iterator;
    std::cout << "Copied Key=" << copy_of_pair.first
              << " Copied Value=" << copy_of_pair.second
              << std::endl;
  }
  return 0;
}